

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O3

Maybe<kj::Promise<unsigned_long>_> __thiscall
kj::anon_unknown_123::AsyncPipe::BlockedRead::tryPumpFrom
          (BlockedRead *this,AsyncInputStream *input,uint64_t amount)

{
  PromiseArena *params;
  _func_int **pp_Var1;
  PromiseArena *pPVar2;
  OwnPromiseNode OVar3;
  Fault node;
  BlockedRead *pBVar4;
  void *pvVar5;
  PromiseArena *in_RCX;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<unsigned_long>_>_2 extraout_RDX;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<unsigned_long>_>_2 extraout_RDX_00;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<unsigned_long>_>_2 extraout_RDX_01;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<unsigned_long>_>_2 aVar6;
  Exception *this_00;
  bool bVar7;
  Maybe<kj::Promise<unsigned_long>_> MVar8;
  OwnPromiseNode local_90;
  DebugExpression<bool> _kjCondition;
  undefined7 uStack_87;
  OwnPromiseNode local_70;
  BlockedRead *local_68;
  Fault f;
  _func_int **local_38;
  
  bVar7 = input[0xc]._vptr_AsyncInputStream == (_func_int **)0x0;
  _kjCondition.value = bVar7;
  if (!bVar7) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[16]>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++"
               ,0x445,FAILED,"canceler.isEmpty()","_kjCondition,\"already pumping\"",&_kjCondition,
               (char (*) [16])"already pumping");
    kj::_::Debug::Fault::fatal(&f);
  }
  f.exception = (Exception *)(input + 6);
  if (input[10]._vptr_AsyncInputStream <= input[6]._vptr_AsyncInputStream &&
      input[6]._vptr_AsyncInputStream != input[10]._vptr_AsyncInputStream) {
    params = (PromiseArena *)(input + 0xc);
    local_68 = this;
    (**(code **)(*(long *)amount + 8))(&local_90,amount,input[4]._vptr_AsyncInputStream);
    OVar3.ptr = local_90.ptr;
    pp_Var1 = input[2]._vptr_AsyncInputStream;
    pPVar2 = ((local_90.ptr)->super_PromiseArenaMember).arena;
    if (pPVar2 == (PromiseArena *)0x0 || (ulong)((long)local_90.ptr - (long)pPVar2) < 0x48) {
      pvVar5 = operator_new(0x400);
      this_00 = (Exception *)((long)pvVar5 + 0x3b8);
      kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                ((TransformPromiseNodeBase *)this_00,&local_90,
                 kj::_::
                 TransformPromiseNode<unsigned_long,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:1100:17),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:465:12)>
                 ::anon_class_24_3_e7c12ea1_for_func::operator());
      *(undefined ***)((long)pvVar5 + 0x3b8) = &PTR_destroy_006debf0;
      *(AsyncInputStream **)((long)pvVar5 + 0x3d8) = input;
      *(uint64_t *)((long)pvVar5 + 0x3e0) = amount;
      *(PromiseArena **)((long)pvVar5 + 1000) = in_RCX;
      *(_func_int ***)((long)pvVar5 + 0x3f0) = pp_Var1;
      *(PromiseArena **)((long)pvVar5 + 0x3f8) = params;
      *(void **)((long)pvVar5 + 0x3c0) = pvVar5;
    }
    else {
      ((local_90.ptr)->super_PromiseArenaMember).arena = (PromiseArena *)0x0;
      this_00 = (Exception *)&local_90.ptr[-5].super_PromiseArenaMember.arena;
      kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                ((TransformPromiseNodeBase *)this_00,&local_90,
                 kj::_::
                 TransformPromiseNode<unsigned_long,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:1100:17),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:465:12)>
                 ::anon_class_24_3_e7c12ea1_for_func::operator());
      OVar3.ptr[-5].super_PromiseArenaMember.arena = (PromiseArena *)&PTR_destroy_006debf0;
      OVar3.ptr[-3].super_PromiseArenaMember.arena = (PromiseArena *)input;
      OVar3.ptr[-2].super_PromiseArenaMember._vptr_PromiseArenaMember = (_func_int **)amount;
      OVar3.ptr[-2].super_PromiseArenaMember.arena = in_RCX;
      OVar3.ptr[-1].super_PromiseArenaMember._vptr_PromiseArenaMember = pp_Var1;
      OVar3.ptr[-1].super_PromiseArenaMember.arena = params;
      OVar3.ptr[-4].super_PromiseArenaMember._vptr_PromiseArenaMember = (_func_int **)pPVar2;
    }
    f.exception = (Exception *)anon_var_dwarf_d0108e;
    __kjCondition = this_00;
    kj::_::PromiseDisposer::
    appendPromise<kj::_::ChainPromiseNode,kj::_::PromiseDisposer,kj::SourceLocation&>
              ((PromiseDisposer *)&local_70,(OwnPromiseNode *)&_kjCondition,(SourceLocation *)&f);
    pBVar4 = local_68;
    node.exception = __kjCondition;
    if (__kjCondition != (Exception *)0x0) {
      __kjCondition = (Exception *)0x0;
      kj::_::PromiseDisposer::dispose((PromiseArenaMember *)node.exception);
    }
    kj::_::PromiseDisposer::
    alloc<kj::_::AdapterPromiseNode<unsigned_long,kj::Canceler::AdapterImpl<unsigned_long>>,kj::_::PromiseDisposer,kj::Canceler&,kj::Promise<unsigned_long>>
              ((PromiseDisposer *)&local_38,(Canceler *)params,(Promise<unsigned_long> *)&local_70);
    OVar3.ptr = local_70.ptr;
    *(undefined1 *)
     &(pBVar4->super_AsyncCapabilityStream).super_AsyncIoStream.super_AsyncInputStream.
      _vptr_AsyncInputStream = 1;
    (pBVar4->super_AsyncCapabilityStream).super_AsyncIoStream.super_AsyncOutputStream.
    _vptr_AsyncOutputStream = local_38;
    local_38 = (_func_int **)0x0;
    aVar6 = extraout_RDX;
    if (&(local_70.ptr)->super_PromiseArenaMember != (PromiseArenaMember *)0x0) {
      local_70.ptr = (PromiseNode *)0x0;
      kj::_::PromiseDisposer::dispose(&(OVar3.ptr)->super_PromiseArenaMember);
      aVar6 = extraout_RDX_00;
    }
    OVar3.ptr = local_90.ptr;
    if (&(local_90.ptr)->super_PromiseArenaMember != (PromiseArenaMember *)0x0) {
      local_90.ptr = (PromiseNode *)0x0;
      kj::_::PromiseDisposer::dispose(&(OVar3.ptr)->super_PromiseArenaMember);
      aVar6 = extraout_RDX_01;
    }
    MVar8.ptr.field_1 = aVar6;
    MVar8.ptr._0_8_ = pBVar4;
    return (Maybe<kj::Promise<unsigned_long>_>)MVar8.ptr;
  }
  kj::_::Debug::Fault::
  Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long&,unsigned_long&>&>
            ((Fault *)&_kjCondition,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++"
             ,0x447,FAILED,"minBytes > readSoFar.byteCount","_kjCondition,",
             (DebugComparison<unsigned_long_&,_unsigned_long_&> *)&f);
  kj::_::Debug::Fault::fatal((Fault *)&_kjCondition);
}

Assistant:

TwoWayPipe newTwoWayPipe() {
  auto pipe1 = kj::refcounted<AsyncPipe>();
  auto pipe2 = kj::refcounted<AsyncPipe>();
  auto end1 = kj::heap<TwoWayPipeEnd>(kj::addRef(*pipe1), kj::addRef(*pipe2));
  auto end2 = kj::heap<TwoWayPipeEnd>(kj::mv(pipe2), kj::mv(pipe1));
  return { { kj::mv(end1), kj::mv(end2) } };
}